

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O3

size_t gog::anon_unknown_0::probe_bin_file_series
                 (extract_options *o,info *info,path *dir,string *basename,size_t format,
                 size_t start)

{
  error_code *this;
  pointer pcVar1;
  long lVar2;
  long lVar3;
  pointer ppVar4;
  char cVar5;
  bool bVar6;
  size_t i;
  logger *plVar7;
  long *plVar8;
  long lVar9;
  info *piVar10;
  __sighandler_t p_Var11;
  __sighandler_t p_Var12;
  ostream *poVar13;
  _func_int **pp_Var14;
  runtime_error *prVar15;
  size_type *psVar16;
  string *psVar17;
  byte bVar18;
  char cVar19;
  undefined8 uVar20;
  _Alloc_hider _Var21;
  extract_options *peVar22;
  _func_int *p_Var23;
  undefined1 auVar24 [16];
  path first_file;
  string basename_1;
  char hash [16];
  path here;
  path p;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> files;
  char magic [4];
  path symlink;
  string password;
  path file;
  ifstream ifs;
  string local_538;
  string local_518;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  long *local_490;
  long local_488;
  long local_480 [2];
  extract_options *local_470;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> local_468;
  int local_444;
  undefined1 *local_440;
  undefined8 local_438;
  undefined1 local_430;
  undefined7 uStack_42f;
  string *local_420;
  info *local_418;
  string local_410;
  size_t local_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  __sighandler_t local_3c8;
  __sighandler_t local_3c0;
  undefined1 local_3b8 [8];
  undefined1 local_3b0 [8];
  undefined1 local_3a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  undefined1 local_378 [24];
  undefined8 local_360;
  undefined1 local_358 [64];
  _Alloc_hider local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [9];
  undefined1 local_238 [8];
  streamsize local_230;
  _func_int *local_228 [30];
  undefined8 local_138 [33];
  
  local_468.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_468.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_420 = (string *)CONCAT71(local_420._1_7_,format != 0);
  local_3f0 = 0;
  local_470 = o;
  local_418 = info;
  do {
    local_3b0 = (undefined1  [8])(local_3a8 + 8);
    local_3a8 = (undefined1  [8])0x0;
    local_3a0._0_8_ = local_3a0._0_8_ & 0xffffffffffffff00;
    if (format == 0) {
      local_4f8._0_8_ = local_4f8 + 0x10;
      pcVar1 = (basename->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4f8,pcVar1,pcVar1 + basename->_M_string_length);
      local_238 = (undefined1  [8])local_228;
      pcVar1 = (dir->m_pathname)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,pcVar1,pcVar1 + (dir->m_pathname)._M_string_length);
      boost::filesystem::path::operator/=((path *)local_238,(path *)local_4f8);
      std::__cxx11::string::operator=((string *)local_3b0,(string *)local_238);
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238,(ulong)(local_228[0] + 1));
      }
      if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
        uVar20 = CONCAT71(local_4e8._1_7_,local_4e8[0]);
        _Var21._M_p = (pointer)local_4f8._0_8_;
        goto LAB_00120751;
      }
    }
    else {
      stream::slice_reader::slice_filename(&local_538,basename,start,format);
      local_4f8._0_8_ = local_4f8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4f8,local_538._M_dataplus._M_p,
                 local_538._M_dataplus._M_p + local_538._M_string_length);
      local_238 = (undefined1  [8])local_228;
      pcVar1 = (dir->m_pathname)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,pcVar1,pcVar1 + (dir->m_pathname)._M_string_length);
      boost::filesystem::path::operator/=((path *)local_238,(path *)local_4f8);
      std::__cxx11::string::operator=((string *)local_3b0,(string *)local_238);
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238,(ulong)(local_228[0] + 1));
      }
      if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
        operator_delete((void *)local_4f8._0_8_,CONCAT71(local_4e8._1_7_,local_4e8[0]) + 1);
      }
      uVar20 = local_538.field_2._M_allocated_capacity;
      _Var21._M_p = local_538._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
LAB_00120751:
        operator_delete(_Var21._M_p,uVar20 + 1);
      }
    }
    boost::filesystem::detail::status((path *)local_3b8,(error_code *)local_3b0);
    if (local_3b8._0_4_ == 2) {
      if (local_470->gog == true) {
        std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::push_back
                  (&local_468,(value_type *)local_3b0);
        cVar5 = (char)local_420;
      }
      else {
        local_238._0_4_ = 2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
        boost::filesystem::path::filename();
        plVar7 = logger::operator<<((logger *)local_238,(path *)local_4f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&plVar7->buffer," is not part of the installer!",0x1e);
        if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
          operator_delete((void *)local_4f8._0_8_,CONCAT71(local_4e8._1_7_,local_4e8[0]) + 1);
        }
        logger::~logger((logger *)local_238);
        local_3f0 = local_3f0 + 1;
        cVar5 = (char)local_420;
      }
    }
    else {
      cVar5 = '\0';
    }
    if (local_3b0 != (undefined1  [8])(local_3a8 + 8)) {
      operator_delete((void *)local_3b0,local_3a0._0_8_ + 1);
    }
    start = start + 1;
  } while (cVar5 != '\0');
  if (local_468.
      super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_468.
      super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001212bb;
  boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)local_238,
             local_468.
             super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
             _M_impl.super__Vector_impl_data._M_start,_S_in|_S_bin);
  cVar5 = std::__basic_file<char>::is_open();
  peVar22 = local_470;
  if (cVar5 == '\0') {
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8,
                   "Could not open file \"",
                   &(local_468.
                     super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_pathname);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8,
                   '\"');
    std::runtime_error::runtime_error(prVar15,(string *)local_3b0);
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  plVar8 = (long *)std::istream::read(local_238,(long)&local_444);
  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
LAB_001212e2:
    auVar24 = __cxa_allocate_exception(0x10);
    (anonymous_namespace)::get_verb_abi_cxx11_
              (&local_518,(_anonymous_namespace_ *)peVar22,auVar24._8_8_);
    std::operator+(&local_4b0,"Could not ",&local_518);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_4b0);
    local_538._M_dataplus._M_p = (pointer)*plVar8;
    psVar16 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_538._M_dataplus._M_p == psVar16) {
      local_538.field_2._M_allocated_capacity = *psVar16;
      local_538.field_2._8_8_ = plVar8[3];
      local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    }
    else {
      local_538.field_2._M_allocated_capacity = *psVar16;
    }
    local_538._M_string_length = plVar8[1];
    *plVar8 = (long)psVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8,
                   &local_538,
                   &(local_468.
                     super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_pathname);
    plVar8 = (long *)std::__cxx11::string::append(local_4f8);
    local_3b0 = (undefined1  [8])*plVar8;
    pp_Var14 = (_func_int **)(plVar8 + 2);
    if (local_3b0 == (undefined1  [8])pp_Var14) {
      local_3a0._M_allocated_capacity = (size_type)*pp_Var14;
      local_3a0._8_8_ = plVar8[3];
      local_3b0 = (undefined1  [8])(local_3a8 + 8);
    }
    else {
      local_3a0._M_allocated_capacity = (size_type)*pp_Var14;
    }
    local_3a8 = (undefined1  [8])plVar8[1];
    *plVar8 = (long)pp_Var14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::runtime_error::runtime_error(auVar24._0_8_,(string *)local_3b0);
    __cxa_throw(auVar24._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_444 == 0x21726152) {
    std::ifstream::close();
    if ((((peVar22->list != false) || (peVar22->test != false)) || (peVar22->extract == true)) &&
       (local_468.
        super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_468.
        super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      get_game_id(&local_410,local_418);
      if (local_410._M_string_length != 0) {
        local_360 = 0;
        crypto::md5_transform::init((EVP_PKEY_CTX *)(local_378 + 8));
        crypto::iterated_hash<crypto::md5_transform>::update
                  ((iterated_hash<crypto::md5_transform> *)local_3b0,local_410._M_dataplus._M_p,
                   local_410._M_string_length);
        crypto::iterated_hash<crypto::md5_transform>::finalize
                  ((iterated_hash<crypto::md5_transform> *)local_3b0,local_4f8);
        std::__cxx11::string::resize((ulong)&local_410,' ');
        lVar9 = 0;
        do {
          cVar5 = '0';
          cVar19 = '0';
          if (0x9f < (byte)local_4f8[lVar9]) {
            cVar19 = 'W';
          }
          local_410._M_dataplus._M_p[lVar9 * 2] = cVar19 + ((byte)local_4f8[lVar9] >> 4);
          if (9 < (local_4f8[lVar9] & 0xf)) {
            cVar5 = 'W';
          }
          local_410._M_dataplus._M_p[lVar9 * 2 + 1] = cVar5 + (local_4f8[lVar9] & 0xf);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x10);
      }
      ppVar4 = local_468.
               super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((((peVar22->extract == false) && (peVar22->test == false)) && (peVar22->list == true)) ||
         ((long)local_468.
                super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_468.
                super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20)) {
        if (local_468.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_468.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          bVar18 = 1;
          psVar17 = &(local_468.
                      super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_pathname;
          do {
            bVar6 = process_rar_file(psVar17,peVar22,&local_410);
            bVar18 = bVar18 & bVar6;
            psVar17 = psVar17 + 1;
          } while (psVar17 != &ppVar4->m_pathname);
          if (bVar18 == 0) goto LAB_001214aa;
        }
      }
      else {
        piVar10 = (info *)signal(2,quit_handler);
        p_Var11 = signal(0xf,quit_handler);
        p_Var12 = signal(1,quit_handler);
        local_4f8._0_8_ = local_4f8 + 0x10;
        local_4f8._8_8_ = 0;
        local_4e8[0] = '\0';
        local_4e8._16_8_ = &local_4c8;
        local_4e8._24_8_ = 0;
        local_4c8._M_local_buf[0] = None;
        if ((peVar22->output_dir).m_pathname._M_string_length != 0) {
          boost::filesystem::detail::status((path *)&local_538,(error_code *)&peVar22->output_dir);
          if ((uint)local_538._M_dataplus._M_p < 2) {
            boost::filesystem::detail::create_directory
                      (&peVar22->output_dir,(path *)0x0,(error_code *)0x0);
            std::__cxx11::string::_M_assign((string *)local_4f8);
          }
        }
        local_418 = piVar10;
        local_3c8 = p_Var12;
        local_3c0 = p_Var11;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        do {
          local_538._M_string_length = 0;
          local_538.field_2._M_allocated_capacity =
               local_538.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          std::__cxx11::stringbuf::str((string *)local_3a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          this = (error_code *)(local_4f8 + 0x20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"innoextract-tmp-",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3b0);
          std::__cxx11::stringbuf::str();
          local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4b0,local_518._M_dataplus._M_p,
                     local_518._M_dataplus._M_p + local_518._M_string_length);
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          pcVar1 = (local_470->output_dir).m_pathname._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,pcVar1,
                     pcVar1 + (local_470->output_dir).m_pathname._M_string_length);
          boost::filesystem::path::operator/=((path *)&local_538,(path *)&local_4b0);
          std::__cxx11::string::operator=((string *)this,(string *)&local_538);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
            operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          boost::filesystem::detail::status((path *)&local_538,this);
        } while (1 < (uint)local_538._M_dataplus._M_p);
        boost::filesystem::detail::create_directory((path *)this,(path *)0x0,(error_code *)0x0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base((ios_base *)(local_358 + 0x18));
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        local_538._M_string_length = 0;
        local_538.field_2._M_allocated_capacity =
             local_538.field_2._M_allocated_capacity & 0xffffffffffffff00;
        boost::filesystem::detail::current_path((error_code *)&local_4b0);
        boost::filesystem::path::stem();
        local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_518,local_3b0,(pointer)((long)local_3b0 + (long)local_3a8));
        if (local_3b0 != (undefined1  [8])(local_3a8 + 8)) {
          operator_delete((void *)local_3b0,local_3a0._0_8_ + 1);
        }
        lVar9 = 0;
        do {
          if ((-lVar9 == local_518._M_string_length) || (lVar9 == -2)) {
            if (lVar9 == -2) {
              std::__cxx11::string::resize((ulong)&local_518,(char)local_518._M_string_length + -2);
            }
            break;
          }
          lVar2 = lVar9 + (local_518._M_string_length - 1);
          lVar3 = lVar9 + 1;
          lVar9 = lVar9 + -1;
        } while (local_518._M_dataplus._M_p[lVar2] == "-1"[lVar3]);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        local_420 = &(local_468.
                      super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->m_pathname;
        if (local_468.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_468.
            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar9 = 0;
          psVar17 = &(local_468.
                      super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_pathname;
          do {
            local_438 = 0;
            local_430 = 0;
            local_440 = &local_430;
            std::__cxx11::stringbuf::str((string *)local_3a8);
            if (local_440 != &local_430) {
              operator_delete(local_440,CONCAT71(uStack_42f,local_430) + 1);
            }
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,local_518._M_dataplus._M_p,
                                 local_518._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,".r",2);
            pp_Var14 = poVar13->_vptr_basic_ostream;
            p_Var23 = (_func_int *)((long)&poVar13->_vptr_basic_ostream + (long)pp_Var14[-3]);
            if ((&poVar13->field_0xe1)[(long)pp_Var14[-3]] == '\0') {
              std::ios::widen((char)p_Var23);
              p_Var23[0xe1] = (code)0x1;
              pp_Var14 = poVar13->_vptr_basic_ostream;
            }
            p_Var23[0xe0] = (code)0x30;
            *(undefined8 *)(&poVar13->field_0x10 + (long)pp_Var14[-3]) = 2;
            std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
            std::__cxx11::stringbuf::str();
            local_490 = local_480;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_490,local_3e8,local_3e0 + (long)local_3e8);
            local_440 = &local_430;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_440,local_4e8._16_8_,local_4e8._24_8_ + local_4e8._16_8_);
            boost::filesystem::path::operator/=((path *)&local_440,(path *)&local_490);
            if (local_490 != local_480) {
              operator_delete(local_490,local_480[0] + 1);
            }
            if (local_3e8 != local_3d8) {
              operator_delete(local_3e8,local_3d8[0] + 1);
            }
            boost::filesystem::path::root_path();
            lVar2 = local_488;
            if (local_490 != local_480) {
              operator_delete(local_490,local_480[0] + 1);
            }
            if (lVar2 == 0) {
              local_490 = local_480;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_490,local_4b0._M_dataplus._M_p,
                         local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
              boost::filesystem::path::operator/=((path *)&local_490,(path *)psVar17);
              boost::filesystem::detail::create_symlink
                        ((path *)&local_490,(path *)&local_440,(error_code *)0x0);
              if (local_490 != local_480) {
                operator_delete(local_490,local_480[0] + 1);
              }
            }
            else {
              boost::filesystem::detail::create_symlink
                        ((path *)psVar17,(path *)&local_440,(error_code *)0x0);
            }
            if (lVar9 == 0) {
              std::__cxx11::string::_M_assign((string *)&local_538);
            }
            if (local_440 != &local_430) {
              operator_delete(local_440,CONCAT71(uStack_42f,local_430) + 1);
            }
            psVar17 = psVar17 + 1;
            lVar9 = lVar9 + 1;
          } while (psVar17 != local_420);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base((ios_base *)(local_358 + 0x18));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        peVar22 = local_470;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        bVar6 = process_rar_file(&local_538,peVar22,&local_410);
        if (!bVar6) {
          signal(1,local_3c8);
          signal(0xf,local_3c0);
          signal(2,(__sighandler_t)local_418);
          if ((anonymous_namespace)::quit_requested != 0) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar15,"Aborted!");
            __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          temporary_directory::~temporary_directory((temporary_directory *)local_4f8);
          peVar22 = local_470;
LAB_001214aa:
          auVar24 = __cxa_allocate_exception(0x10);
          (anonymous_namespace)::get_verb_abi_cxx11_
                    (&local_518,(_anonymous_namespace_ *)peVar22,auVar24._8_8_);
          std::operator+(&local_4b0,"Could not ",&local_518);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_4b0);
          local_538._M_dataplus._M_p = (pointer)*plVar8;
          psVar16 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_538._M_dataplus._M_p == psVar16) {
            local_538.field_2._M_allocated_capacity = *psVar16;
            local_538.field_2._8_8_ = plVar8[3];
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          }
          else {
            local_538.field_2._M_allocated_capacity = *psVar16;
          }
          local_538._M_string_length = plVar8[1];
          *plVar8 = (long)psVar16;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4f8,&local_538,
                         &(local_468.
                           super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_pathname);
          plVar8 = (long *)std::__cxx11::string::append(local_4f8);
          local_3b0 = (undefined1  [8])*plVar8;
          pp_Var14 = (_func_int **)(plVar8 + 2);
          if (local_3b0 == (undefined1  [8])pp_Var14) {
            local_3a0._M_allocated_capacity = (size_type)*pp_Var14;
            local_3a0._8_8_ = plVar8[3];
            local_3b0 = (undefined1  [8])(local_3a8 + 8);
          }
          else {
            local_3a0._M_allocated_capacity = (size_type)*pp_Var14;
          }
          local_3a8 = (undefined1  [8])plVar8[1];
          *plVar8 = (long)pp_Var14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::runtime_error::runtime_error(auVar24._0_8_,(string *)local_3b0);
          __cxa_throw(auVar24._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                     );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        temporary_directory::~temporary_directory((temporary_directory *)local_4f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) goto LAB_0012125e;
    }
  }
  else {
    if (((short)local_444 != 0x5a4d) ||
       (loader::offsets::load((offsets *)local_4f8,(istream *)local_238), local_4c8._8_4_ == 0))
    goto LAB_001212e2;
    std::ifstream::close();
    extract_options::extract_options((extract_options *)local_3b0,peVar22);
    local_3a8 = (undefined1  [8])((ulong)local_3a8 & 0xffffffffffffff);
    local_3b0[2] = 0;
    local_538._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_538,1);
    process_file(local_468.
                 super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                 ._M_impl.super__Vector_impl_data._M_start,(extract_options *)local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != local_2c8) {
      operator_delete(local_2d8._M_p,local_2c8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_p != &local_308) {
      operator_delete(local_318._M_p,local_308._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_358);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_378);
    local_410.field_2._M_allocated_capacity = local_388._M_allocated_capacity;
    local_410._M_dataplus._M_p = (pointer)local_3a0._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._8_8_ != &local_388) {
LAB_0012125e:
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
  }
  local_238 = (undefined1  [8])
              (std::ifstream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
               construction_vtable + 0x18);
  local_138[0] = 0x16f8a0;
  std::filebuf::~filebuf((filebuf *)local_228);
  local_238 = (undefined1  [8])
              (std::istream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
               construction_vtable + 0x18);
  local_138[0] = 0x16f8f0;
  local_230 = 0;
  std::ios_base::~ios_base((ios_base *)local_138);
LAB_001212bb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_468);
  return local_3f0;
}

Assistant:

size_t probe_bin_file_series(const extract_options & o, const setup::info & info, const fs::path & dir,
                             const std::string & basename, size_t format = 0, size_t start = 0) {
	
	size_t count = 0;
	
	std::vector<fs::path> files;
	
	for(size_t i = start;; i++) {
		
		fs::path file;
		if(format == 0) {
			file = dir / basename;
		} else {
			file = dir / stream::slice_reader::slice_filename(basename, i, format);
		}
		
		try {
			if(!fs::is_regular_file(file)) {
				break;
			}
		} catch(...) {
			break;
		}
		
		if(o.gog) {
			files.push_back(file);
		} else {
			log_warning << file.filename() << " is not part of the installer!";
			count++;
		}
		
		if(format == 0) {
			break;
		}
		
	}
	
	if(!files.empty()) {
		process_bin_files(files, o, info);
	}
	
	return count;
}